

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServer::WriteJsonObject(cmServer *this,Value *jsonValue,DebugInfo *debug)

{
  bool bVar1;
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  *this_00;
  reference this_01;
  pointer connection_00;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *connection;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  *__range1;
  shared_lock<cm::shared_mutex> lock;
  DebugInfo *debug_local;
  Value *jsonValue_local;
  cmServer *this_local;
  
  lock._mutex = (shared_mutex *)debug;
  ::cm::shared_lock<cm::shared_mutex>::shared_lock
            ((shared_lock<cm::shared_mutex> *)&__range1,&(this->super_cmServerBase).ConnectionsMutex
            );
  this_00 = &(this->super_cmServerBase).Connections;
  __end1 = std::
           vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ::begin(this_00);
  connection = (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
               std::
               vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
               ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
                                *)&connection);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
              ::operator*(&__end1);
    connection_00 = std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>::get(this_01);
    WriteJsonObject(this,connection_00,jsonValue,(DebugInfo *)lock._mutex);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
    ::operator++(&__end1);
  }
  ::cm::shared_lock<cm::shared_mutex>::~shared_lock((shared_lock<cm::shared_mutex> *)&__range1);
  return;
}

Assistant:

void cmServer::WriteJsonObject(const Json::Value& jsonValue,
                               const DebugInfo* debug) const
{
  cm::shared_lock<cm::shared_mutex> lock(ConnectionsMutex);
  for (auto& connection : this->Connections) {
    WriteJsonObject(connection.get(), jsonValue, debug);
  }
}